

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O2

Constant *
spvtools::opt::anon_unknown_0::FoldTranspose
          (IRContext *context,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *constants)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  TypeManager *this;
  Type *pTVar5;
  undefined4 extraout_var;
  ConstantManager *this_00;
  undefined4 extraout_var_00;
  Constant *pCVar6;
  undefined4 extraout_var_01;
  undefined8 *puVar7;
  long lVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long *plVar9;
  Instruction *pIVar10;
  uint32_t row;
  ulong uVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  ulong __n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result_columns;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  result_elements;
  allocator_type local_79;
  Type *local_78;
  long *local_70;
  long *local_68;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_48;
  
  if (inst->opcode_ != OpTranspose) {
    __assert_fail("inst->opcode() == spv::Op::OpTranspose",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                  ,0x195,
                  "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldTranspose(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  this = IRContext::get_type_mgr(context);
  bVar1 = Instruction::IsFloatingPointFoldingAllowed(inst);
  if (!bVar1) {
    uVar2 = Instruction::type_id(inst);
    pTVar5 = analysis::TypeManager::GetType(this,uVar2);
    bVar1 = HasFloatingPoint(pTVar5);
    if (bVar1) {
      return (Constant *)0x0;
    }
  }
  pCVar6 = *(constants->
            super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pCVar6 == (Constant *)0x0) {
    return (Constant *)0x0;
  }
  uVar2 = Instruction::type_id(inst);
  pTVar5 = analysis::TypeManager::GetType(this,uVar2);
  iVar3 = (*pTVar5->_vptr_Type[0xf])(pTVar5);
  this_00 = IRContext::get_constant_mgr(context);
  iVar4 = (*pCVar6->_vptr_Constant[0x16])(pCVar6);
  if (CONCAT44(extraout_var_00,iVar4) != 0) {
    pCVar6 = analysis::ConstantManager::GetNullCompositeConstant
                       (this_00,(Type *)CONCAT44(extraout_var,iVar3));
    return pCVar6;
  }
  local_78 = (Type *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*pCVar6->_vptr_Constant[0x14])(pCVar6);
  puVar7 = (undefined8 *)
           (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0xc0))
                     ((long *)CONCAT44(extraout_var_01,iVar3));
  lVar8 = (**(code **)(**(long **)(*(long *)*puVar7 + 8) + 0x70))();
  __n = (ulong)*(uint *)(lVar8 + 0x30);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_48,__n,(allocator_type *)&local_60);
  local_70 = (long *)puVar7[1];
  plVar9 = (long *)*puVar7;
  while (plVar9 != local_70) {
    pCVar6 = (Constant *)*plVar9;
    local_68 = plVar9;
    iVar3 = (*pCVar6->_vptr_Constant[0x16])(pCVar6);
    if (CONCAT44(extraout_var_02,iVar3) != 0) {
      pCVar6 = analysis::ConstantManager::GetNullCompositeConstant(this_00,pCVar6->type_);
    }
    iVar3 = (*pCVar6->_vptr_Constant[0x13])(pCVar6);
    plVar9 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0xc0))
                               ((long *)CONCAT44(extraout_var_03,iVar3));
    for (uVar11 = 0; uVar11 != __n; uVar11 = uVar11 + 1) {
      this_01 = local_48.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar11;
      pIVar10 = analysis::ConstantManager::GetDefiningInstruction
                          (this_00,*(Constant **)(*plVar9 + uVar11 * 8),0,(inst_iterator *)0x0);
      local_60._M_impl.super__Vector_impl_data._M_start._0_4_ = Instruction::result_id(pIVar10);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (this_01,(uint *)&local_60);
    }
    plVar9 = local_68 + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,__n,&local_79);
  pTVar5 = local_78;
  for (uVar11 = 0; uVar11 != __n; uVar11 = uVar11 + 1) {
    pCVar6 = analysis::ConstantManager::GetConstant
                       (this_00,(Type *)pTVar5[1]._vptr_Type,
                        local_48.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar11);
    pIVar10 = analysis::ConstantManager::GetDefiningInstruction
                        (this_00,pCVar6,0,(inst_iterator *)0x0);
    uVar2 = Instruction::result_id(pIVar10);
    *(uint32_t *)
     (CONCAT44(local_60._M_impl.super__Vector_impl_data._M_start._4_4_,
               (uint32_t)local_60._M_impl.super__Vector_impl_data._M_start) + uVar11 * 4) = uVar2;
  }
  pCVar6 = analysis::ConstantManager::GetConstant
                     (this_00,pTVar5,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_48);
  return pCVar6;
}

Assistant:

const analysis::Constant* FoldTranspose(
    IRContext* context, Instruction* inst,
    const std::vector<const analysis::Constant*>& constants) {
  assert(inst->opcode() == spv::Op::OpTranspose);

  analysis::TypeManager* type_mgr = context->get_type_mgr();
  if (!inst->IsFloatingPointFoldingAllowed()) {
    if (HasFloatingPoint(type_mgr->GetType(inst->type_id()))) {
      return nullptr;
    }
  }

  const analysis::Constant* matrix = constants[0];
  if (matrix == nullptr) {
    return nullptr;
  }

  auto* result_type = type_mgr->GetType(inst->type_id());
  return TransposeMatrix(matrix, result_type->AsMatrix(), context);
}